

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ThrowRangeError(JSContext *ctx,char *fmt,...)

{
  char *in_RCX;
  __va_list_tag *in_RDX;
  undefined8 in_R8;
  JSContext *in_R9;
  JSValue JVar1;
  va_list ap;
  JSValue val;
  
  JVar1 = JS_ThrowError(in_R9,(JSErrorEnum)((ulong)in_R8 >> 0x20),in_RCX,in_RDX);
  return JVar1;
}

Assistant:

JSValue __attribute__((format(printf, 2, 3))) JS_ThrowRangeError(JSContext *ctx, const char *fmt, ...)
{
    JSValue val;
    va_list ap;

    va_start(ap, fmt);
    val = JS_ThrowError(ctx, JS_RANGE_ERROR, fmt, ap);
    va_end(ap);
    return val;
}